

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_noise_estimate.c
# Opt level: O3

NOISE_LEVEL av1_noise_estimate_extract_level(NOISE_ESTIMATE *ne)

{
  int iVar1;
  int iVar2;
  NOISE_LEVEL NVar3;
  
  iVar1 = ne->value;
  iVar2 = ne->thresh;
  NVar3 = kHigh;
  if ((iVar1 == iVar2 * 2 || SBORROW4(iVar1,iVar2 * 2) != iVar1 + iVar2 * -2 < 0) &&
     (NVar3 = kMedium, iVar1 <= iVar2)) {
    NVar3 = (NOISE_LEVEL)(iVar2 >> 1 < iVar1);
  }
  return NVar3;
}

Assistant:

NOISE_LEVEL av1_noise_estimate_extract_level(NOISE_ESTIMATE *const ne) {
  int noise_level = kLowLow;
  if (ne->value > (ne->thresh << 1)) {
    noise_level = kHigh;
  } else {
    if (ne->value > ne->thresh)
      noise_level = kMedium;
    else if (ne->value > (ne->thresh >> 1))
      noise_level = kLow;
    else
      noise_level = kLowLow;
  }
  return noise_level;
}